

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O0

void __thiscall
Clasp::Asp::PrgDepGraph::addSccs
          (PrgDepGraph *this,LogicProgram *prg,AtomList *sccAtoms,NonHcfSet *nonHcfs)

{
  PrgAtom *this_00;
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 uVar4;
  size_type sVar5;
  const_reference ppPVar6;
  Solver *ctx_00;
  reference pBVar7;
  long lVar8;
  SharedContext *pSVar9;
  const_iterator puVar10;
  Extra in_RCX;
  Block *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *sig;
  Solver *in_RSI;
  pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
  *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  const_iterator end_3;
  const_iterator it_3;
  uint32 hcc;
  NonHcfIter end_2;
  NonHcfIter it_2;
  NodeId bodyId;
  dep_iterator endIt_1;
  dep_iterator it_1;
  uint32 nPred;
  NodeId bId;
  sup_iterator endIt;
  sup_iterator it;
  uint32 prop;
  PrgAtom *a_1;
  size_type end_1;
  size_type i_1;
  PrgDisj *prgDis;
  PrgBody *prgBody;
  VarVec ext;
  VarVec adj;
  PrgAtom *a;
  size_type end;
  size_type i;
  SharedContext *ctx;
  size_type numBodies;
  undefined4 in_stack_fffffffffffffd68;
  Id_t in_stack_fffffffffffffd6c;
  LogicProgram *in_stack_fffffffffffffd70;
  Solver *in_stack_fffffffffffffd78;
  SharedContext *in_stack_fffffffffffffd80;
  LogicProgram *in_stack_fffffffffffffd88;
  SharedContext *generator;
  PrgDepGraph *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  iterator in_stack_fffffffffffffdb8;
  PrgDepGraph *in_stack_fffffffffffffdc0;
  LogicProgram *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  LogicProgram *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  uint32 local_184;
  uint32 in_stack_fffffffffffffe84;
  Solver *in_stack_fffffffffffffe88;
  SharedContext *in_stack_fffffffffffffe90;
  Solver *in_stack_fffffffffffffe98;
  uint32 in_stack_fffffffffffffea0;
  undefined2 in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  const_iterator local_f0;
  SharedContext *local_d8;
  undefined1 local_d0 [4];
  undefined1 local_cc [12];
  dep_iterator local_c0;
  size_type local_b8;
  undefined1 local_b4 [12];
  sup_iterator local_a8;
  uint local_9c;
  PrgAtom *local_98;
  size_type local_90;
  size_type local_8c;
  PrgDisj *local_88;
  SharedContext *local_80;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  uint32 local_44;
  PrgAtom *local_40;
  Extra local_38;
  SharedContext *local_30;
  int local_24;
  Extra local_20;
  Block *local_18;
  Solver *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
  ::size(in_RDI);
  bk_lib::pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>::size
            ((pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_> *)local_18);
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
  ::reserve(&in_stack_fffffffffffffd90->atoms_,(size_type)((ulong)in_stack_fffffffffffffd88 >> 0x20)
           );
  local_24 = 0;
  local_30 = ProgramBuilder::ctx((ProgramBuilder *)local_10);
  local_38.num._4_4_ = 0;
  local_38.num._0_4_ =
       bk_lib::pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>::size
                 ((pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_> *)
                  local_18);
  for (; local_38.num._4_4_ != local_38.num._0_4_; local_38.num._4_4_ = local_38.num._4_4_ + 1) {
    ppPVar6 = bk_lib::pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>::
              operator[]((pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>
                          *)local_18,local_38.num._4_4_);
    local_40 = *ppPVar6;
    SharedContext::master((SharedContext *)0x15b3e5);
    bVar1 = relevantPrgAtom((PrgDepGraph *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                            (PrgAtom *)in_stack_fffffffffffffd70);
    this_00 = local_40;
    if (bVar1) {
      local_44 = (uint32)PrgNode::literal((PrgNode *)
                                          CONCAT44(in_stack_fffffffffffffd6c,
                                                   in_stack_fffffffffffffd68));
      PrgAtom::scc(local_40);
      uVar2 = createAtom((PrgDepGraph *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         (Literal)(uint32)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                         (uint32)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      PrgNode::resetId((PrgNode *)this_00,uVar2,true);
      PrgNode::var((PrgNode *)local_40);
      SharedContext::setFrozen
                (in_stack_fffffffffffffd80,(Var)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd78 >> 0x18,0));
      uVar2 = PrgHead::supports((PrgHead *)0x15b49f);
      local_24 = uVar2 + local_24;
    }
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
  ::size((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
          *)(in_RDI + 1));
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
  ::reserve((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
             *)in_stack_fffffffffffffd90,(size_type)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  local_8c = 0;
  local_90 = bk_lib::pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>::size
                       ((pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_> *
                        )local_18);
  for (; local_8c != local_90; local_8c = local_8c + 1) {
    ppPVar6 = bk_lib::pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>::
              operator[]((pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>
                          *)local_18,local_8c);
    local_98 = *ppPVar6;
    ctx_00 = SharedContext::master((SharedContext *)0x15b5a5);
    bVar1 = relevantPrgAtom((PrgDepGraph *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                            (PrgAtom *)in_stack_fffffffffffffd70);
    if (bVar1) {
      local_9c = 0;
      local_a8 = PrgHead::supps_begin((PrgHead *)0x15b5fd);
      local_b4._4_8_ = PrgHead::supps_end((PrgHead *)0x15b624);
      for (; local_a8 != (sup_iterator)local_b4._4_8_; local_a8 = local_a8 + 1) {
        local_b4._0_4_ = 0xfffffff;
        in_stack_fffffffffffffea7 = PrgEdge::isBody((PrgEdge *)0x15b66c);
        if ((!(bool)in_stack_fffffffffffffea7) ||
           (in_stack_fffffffffffffea6 = PrgEdge::isGamma(local_a8), (bool)in_stack_fffffffffffffea6)
           ) {
          bVar1 = PrgEdge::isDisj((PrgEdge *)0x15b7ed);
          if (bVar1) {
            PrgEdge::node(local_a8);
            local_88 = LogicProgram::getDisj(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
            ctx_00 = local_10;
            local_b4._0_4_ =
                 addDisj(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                         (PrgDisj *)in_stack_fffffffffffffd80);
            local_9c = local_9c | 2;
          }
        }
        else {
          in_stack_fffffffffffffe98 = local_10;
          in_stack_fffffffffffffea0 = PrgEdge::node(local_a8);
          in_stack_fffffffffffffe90 =
               (SharedContext *)
               LogicProgram::getBody(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
          local_80 = in_stack_fffffffffffffe90;
          ctx_00 = SharedContext::master((SharedContext *)0x15b70d);
          in_stack_fffffffffffffe88 = ctx_00;
          bVar1 = relevantPrgBody((PrgDepGraph *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78
                                  ,(PrgBody *)in_stack_fffffffffffffd70);
          in_stack_fffffffffffffe84 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe84);
          if (bVar1) {
            ctx_00 = local_10;
            local_184 = addBody((PrgDepGraph *)
                                CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                                in_stack_fffffffffffffdc8,(PrgBody *)in_stack_fffffffffffffdc0);
          }
          else {
            local_184 = 0xfffffff;
          }
          local_b4._0_4_ = local_184;
        }
        if (local_b4._0_4_ != 0xfffffff) {
          ctx_00 = (Solver *)(ulong)(uint)local_b4._0_4_;
          pBVar7 = bk_lib::
                   pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                   ::operator[]((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                                 *)(in_RDI + 1),local_b4._0_4_);
          bVar1 = BodyNode::seen(pBVar7);
          if (!bVar1) {
            pBVar7 = bk_lib::
                     pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                     ::operator[]((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                                   *)(in_RDI + 1),local_b4._0_4_);
            BodyNode::seen(pBVar7,true);
            ctx_00 = (Solver *)local_b4;
            bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffd80,(uint *)in_stack_fffffffffffffd78);
          }
          bVar1 = PrgEdge::isChoice(local_a8);
          if (bVar1) {
            local_9c = local_9c | 1;
          }
        }
      }
      local_b8 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_58);
      local_c0 = PrgAtom::deps_begin((PrgAtom *)0x15b9c8);
      local_cc._4_8_ = PrgAtom::deps_end((PrgAtom *)0x15b9ef);
      sig = extraout_RDX;
      for (; local_c0 != (dep_iterator)local_cc._4_8_; local_c0 = local_c0 + 1) {
        uVar3 = Literal::sign(local_c0,(EVP_PKEY_CTX *)ctx_00,sig,(size_t *)in_RCX.sma,in_R8,in_R9);
        sig = extraout_RDX_00;
        if ((uVar3 & 1) == 0) {
          Literal::var(local_c0);
          local_80 = (SharedContext *)
                     LogicProgram::getBody(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
          ctx_00 = SharedContext::master((SharedContext *)0x15baa7);
          bVar1 = relevantPrgBody((PrgDepGraph *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78
                                  ,(PrgBody *)in_stack_fffffffffffffd70);
          sig = extraout_RDX_01;
          if (bVar1) {
            ctx_00 = local_10;
            uVar2 = PrgBody::scc((PrgBody *)
                                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                                 in_stack_fffffffffffffde0);
            uVar4 = PrgAtom::scc(local_98);
            in_RCX.num._4_4_ = 0;
            in_RCX.num._0_4_ = uVar4;
            sig = extraout_RDX_02;
            if (uVar2 == uVar4) {
              local_cc._0_4_ =
                   addBody((PrgDepGraph *)
                           CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                           in_stack_fffffffffffffdc8,(PrgBody *)in_stack_fffffffffffffdc0);
              pBVar7 = bk_lib::
                       pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                       ::operator[]((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                                     *)(in_RDI + 1),local_cc._0_4_);
              in_stack_fffffffffffffdef = BodyNode::extended(pBVar7);
              if ((bool)in_stack_fffffffffffffdef) {
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffffd80,(uint *)in_stack_fffffffffffffd78);
                in_stack_fffffffffffffde0 =
                     (LogicProgram *)
                     bk_lib::
                     pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                     ::operator[]((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                                   *)(in_RDI + 1),local_cc._0_4_);
                PrgNode::id((PrgNode *)local_98);
                local_d0 = (undefined1  [4])
                           BodyNode::get_pred_idx
                                     ((BodyNode *)in_stack_fffffffffffffd88,
                                      (NodeId)((ulong)in_stack_fffffffffffffd80 >> 0x20));
                ctx_00 = (Solver *)local_d0;
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffffd80,(uint *)in_stack_fffffffffffffd78);
                local_9c = local_9c | 4;
                sig = extraout_RDX_04;
              }
              else {
                ctx_00 = (Solver *)local_cc;
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffffd80,(uint *)in_stack_fffffffffffffd78);
                sig = extraout_RDX_03;
              }
            }
          }
        }
      }
      in_stack_fffffffffffffdd7 =
           bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&local_68);
      if (!(bool)in_stack_fffffffffffffdd7) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffffd80,(uint *)in_stack_fffffffffffffd78);
        in_stack_fffffffffffffdc8 =
             (LogicProgram *)
             bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&local_58);
        in_stack_fffffffffffffdc0 =
             (PrgDepGraph *)
             bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&local_68);
        in_stack_fffffffffffffdb8 =
             bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&local_68);
        bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int*>
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffffd90,(iterator)in_stack_fffffffffffffd88,
                   (uint *)in_stack_fffffffffffffd80,(uint *)in_stack_fffffffffffffd78,
                   (type_conflict *)in_stack_fffffffffffffd70);
      }
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffd80,(uint *)in_stack_fffffffffffffd78);
      uVar2 = PrgNode::id((PrgNode *)local_98);
      in_R8 = (uchar *)(ulong)local_b8;
      in_RCX.sma = (uint32 *)&local_58;
      initAtom(in_stack_fffffffffffffdc0,(uint32)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
               (uint32)in_stack_fffffffffffffdb8,(VarVec *)CONCAT44(uVar2,in_stack_fffffffffffffdb0)
               ,(uint32)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&local_58);
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&local_68);
    }
  }
  sVar5 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20.sma);
  if ((((sVar5 != 0) && (in_RDI[3].ebo_.buf == (pointer)0x0)) &&
      (*(long *)(local_20.num + 0x10) != 0)) &&
     (lVar8 = (**(code **)(**(long **)(local_20.num + 0x10) + 0x18))(),
     (*(byte *)(lVar8 + 8) >> 3 & 3) != 0)) {
    (**(code **)(**(long **)(local_20.num + 0x10) + 0x18))();
    LogicProgram::isIncremental((LogicProgram *)local_10);
    in_stack_fffffffffffffd90 =
         (PrgDepGraph *)
         enableNonHcfStats(in_stack_fffffffffffffd90,
                           (uint32)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
    in_RDI[3].ebo_.buf = (pointer)in_stack_fffffffffffffd90;
  }
  local_d8 = (SharedContext *)nonHcfBegin((PrgDepGraph *)0x15be89);
  generator = local_d8;
  pSVar9 = (SharedContext *)nonHcfEnd((PrgDepGraph *)0x15beaa);
  for (; local_d8 != pSVar9; local_d8 = (SharedContext *)&local_d8->sccGraph) {
    NonHcfComponent::update((NonHcfComponent *)in_stack_fffffffffffffd90,generator);
  }
  local_f0 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20.sma);
  uVar3 = in_RDI[3].ebo_.size;
  puVar10 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                      ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20.sma);
  for (local_f0 = local_f0 + (uVar3 & 0x7fffffff); local_f0 != puVar10; local_f0 = local_f0 + 1) {
    addNonHcf((PrgDepGraph *)
              CONCAT17(in_stack_fffffffffffffea7,
                       CONCAT16(in_stack_fffffffffffffea6,
                                CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))),
              (uint32)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90,
              (Configuration *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  }
  sVar5 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20.sma);
  in_RDI[3].ebo_.size = in_RDI[3].ebo_.size & 0x80000000 | sVar5 & 0x7fffffff;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::~pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15c020);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::~pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15c02d);
  return;
}

Assistant:

void PrgDepGraph::addSccs(LogicProgram& prg, const AtomList& sccAtoms, const NonHcfSet& nonHcfs) {
	// Pass 1: Create graph atom nodes and estimate number of bodies
	atoms_.reserve(atoms_.size() + sccAtoms.size());
	AtomList::size_type numBodies = 0;
	SharedContext& ctx = *prg.ctx();
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom* a = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			// add graph atom node and store link between program node and graph node for later lookup
			a->resetId(createAtom(a->literal(), a->scc()), true);
			// atom is defined by more than just a bunch of clauses
			ctx.setFrozen(a->var(), true);
			numBodies += a->supports();
		}
	}
	// Pass 2: Init atom nodes and create body nodes
	VarVec adj, ext;
	bodies_.reserve(bodies_.size() + numBodies/2);
	PrgBody* prgBody; PrgDisj* prgDis;
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom*   a  = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			uint32 prop = 0;
			for (PrgAtom::sup_iterator it = a->supps_begin(), endIt = a->supps_end(); it != endIt; ++it) {
				assert(it->isBody() || it->isDisj());
				NodeId bId= PrgNode::noNode;
				if (it->isBody() && !it->isGamma()) {
					prgBody = prg.getBody(it->node());
					bId     = relevantPrgBody(*ctx.master(), prgBody) ? addBody(prg, prgBody) : PrgNode::noNode;
				}
				else if (it->isDisj()) {
					prgDis  = prg.getDisj(it->node());
					bId     = addDisj(prg, prgDis);
					prop   |= AtomNode::property_in_disj;
				}
				if (bId != PrgNode::noNode) {
					if (!bodies_[bId].seen()) {
						bodies_[bId].seen(true);
						adj.push_back(bId);
					}
					if (it->isChoice()) {
						// mark atom as in choice
						prop |= AtomNode::property_in_choice;
					}
				}
			}
			uint32 nPred= (uint32)adj.size();
			for (PrgAtom::dep_iterator it = a->deps_begin(), endIt = a->deps_end(); it != endIt; ++it) {
				if (!it->sign()) {
					prgBody = prg.getBody(it->var());
					if (relevantPrgBody(*ctx.master(), prgBody) && prgBody->scc(prg) == a->scc()) {
						NodeId bodyId = addBody(prg, prgBody);
						if (!bodies_[bodyId].extended()) {
							adj.push_back(bodyId);
						}
						else {
							ext.push_back(bodyId);
							ext.push_back(bodies_[bodyId].get_pred_idx(a->id()));
							assert(bodies_[bodyId].get_pred(ext.back()) == a->id());
							prop |= AtomNode::property_in_ext;
						}
					}
				}
			}
			if (!ext.empty()) {
				adj.push_back(idMax);
				adj.insert(adj.end(), ext.begin(), ext.end());
			}
			adj.push_back(idMax);
			initAtom(a->id(), prop, adj, nPred);
			adj.clear(); ext.clear();
		}
	}
	if (nonHcfs.size() != 0 && stats_ == 0 && nonHcfs.config && nonHcfs.config->context().stats) {
		stats_ = enableNonHcfStats(nonHcfs.config->context().stats, prg.isIncremental());
	}
	// "update" existing non-hcf components
	for (NonHcfIter it = nonHcfBegin(), end = nonHcfEnd(); it != end; ++it) {
		(*it)->update(ctx);
	}
	// add new non-hcf components
	uint32 hcc = seenComponents_;
	for (NonHcfSet::const_iterator it = nonHcfs.begin() + seenComponents_, end = nonHcfs.end(); it != end; ++it, ++hcc) {
		addNonHcf(hcc, ctx, nonHcfs.config, *it);
	}
	seenComponents_ = nonHcfs.size();
}